

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

bool filemgr_set_kv_header
               (filemgr *file,kvs_header *kv_header,_func_void_filemgr_ptr *free_kv_header)

{
  kvs_header *pkVar1;
  
  pthread_spin_lock(&file->lock);
  pkVar1 = file->kv_header;
  if (pkVar1 == (kvs_header *)0x0) {
    file->kv_header = kv_header;
    file->free_kv_header = free_kv_header;
  }
  pthread_spin_unlock(&file->lock);
  return pkVar1 == (kvs_header *)0x0;
}

Assistant:

bool filemgr_set_kv_header(struct filemgr *file, struct kvs_header *kv_header,
                           void (*free_kv_header)(struct filemgr *file))
{
    bool ret;
    spin_lock(&file->lock);

    if (!file->kv_header) {
        file->kv_header = kv_header;
        file->free_kv_header = free_kv_header;
        ret = true;
    } else {
        ret = false;
    }

    spin_unlock(&file->lock);

    return ret;
}